

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O3

int luaB_loadstring(lua_State *L)

{
  int iVar1;
  size_t in_RAX;
  char *def;
  char *name;
  int iVar2;
  size_t l;
  size_t local_28;
  
  iVar2 = 1;
  local_28 = in_RAX;
  def = luaL_checklstring(L,1,&local_28);
  name = luaL_optlstring(L,2,def,(size_t *)0x0);
  iVar1 = luaL_loadbuffer(L,def,local_28,name);
  if (iVar1 != 0) {
    lua_pushnil(L);
    lua_insert(L,-2);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int luaB_loadstring (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  const char *chunkname = luaL_optstring(L, 2, s);
  return load_aux(L, luaL_loadbuffer(L, s, l, chunkname));
}